

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O1

double __thiscall chrono::ChSolverAPGD::Res4(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<> *pCVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  Index size;
  char *pcVar8;
  Index index;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  scalar_sum_op<double,_double> local_59;
  undefined1 local_58 [16];
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_40;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_30;
  
  iVar2 = this->nc;
  pCVar1 = &this->tmp;
  (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,pCVar1,&this->gammaNew,0);
  uVar9 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      uVar9) {
    if ((long)uVar9 < 0) {
LAB_007da731:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows == uVar9) {
      uVar3 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if (uVar3 == uVar9) {
        local_58._0_8_ = 1.0 / (double)(iVar2 * iVar2);
        local_58._8_8_ = 0;
        pdVar4 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar5 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar6 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar7 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar9 = uVar3 + 7;
        if (-1 < (long)uVar3) {
          uVar9 = uVar3;
        }
        uVar9 = uVar9 & 0xfffffffffffffff8;
        if (7 < (long)uVar3) {
          auVar11 = vbroadcastsd_avx512f(local_58);
          lVar10 = 0;
          do {
            auVar12 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar6 + lVar10),
                                     *(undefined1 (*) [64])(pdVar5 + lVar10));
            auVar12 = vmulpd_avx512f(auVar11,auVar12);
            auVar12 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + lVar10),auVar12);
            *(undefined1 (*) [64])(pdVar7 + lVar10) = auVar12;
            lVar10 = lVar10 + 8;
          } while (lVar10 < (long)uVar9);
        }
        if ((long)uVar9 < (long)uVar3) {
          do {
            pdVar7[uVar9] = pdVar4[uVar9] - local_58._0_8_ * (pdVar6[uVar9] + pdVar5[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,pCVar1);
        uVar9 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows;
        if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows != uVar9) {
          pcVar8 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007da7aa;
        }
        if ((long)uVar9 < 0) goto LAB_007da731;
        uVar3 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows;
        if (uVar3 == uVar9) {
          pdVar4 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar5 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar6 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          uVar9 = uVar3 + 7;
          if (-1 < (long)uVar3) {
            uVar9 = uVar3;
          }
          uVar9 = uVar9 & 0xfffffffffffffff8;
          if (7 < (long)uVar3) {
            auVar11 = vbroadcastsd_avx512f(local_58);
            lVar10 = 0;
            do {
              auVar12 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + lVar10),
                                       *(undefined1 (*) [64])(pdVar5 + lVar10));
              auVar12 = vdivpd_avx512f(auVar12,auVar11);
              *(undefined1 (*) [64])(pdVar6 + lVar10) = auVar12;
              lVar10 = lVar10 + 8;
            } while (lVar10 < (long)uVar9);
          }
          if ((long)uVar9 < (long)uVar3) {
            do {
              pdVar6[uVar9] = (pdVar4[uVar9] - pdVar5[uVar9]) / local_58._0_8_;
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
          lVar10 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (lVar10 == 0) {
            auVar13 = ZEXT816(0) << 0x40;
          }
          else {
            local_40.m_xpr = pCVar1;
            if (lVar10 < 1) {
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                           );
            }
            local_30.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
            .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
            auVar11._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           (&local_30,&local_59,&local_40);
            auVar11._8_56_ = extraout_var;
            auVar13 = auVar11._0_16_;
          }
          auVar13 = vsqrtsd_avx(auVar13,auVar13);
          return auVar13._0_8_;
        }
        pcVar8 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
        ;
      }
      else {
        pcVar8 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
        ;
      }
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar8);
    }
    pcVar8 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>]"
    ;
  }
  else {
    pcVar8 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
  }
LAB_007da7aa:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar8);
}

Assistant:

double ChSolverAPGD::Res4(ChSystemDescriptor& sysd) {
    // Project the gradient (for rollback strategy)
    // g_proj = (l-project_orthogonal(l - gdiff*g, fric))/gdiff;
    double gdiff = 1.0 / (nc * nc);
    sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew
    tmp = gammaNew - gdiff * (tmp + r);         // Note: no aliasing issues here
    sysd.ConstraintsProject(tmp);               // tmp = ProjectionOperator(gammaNew - gdiff * g)
    tmp = (gammaNew - tmp) / gdiff;             // Note: no aliasing issues here

    return tmp.norm();
}